

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O0

void AddSymTab(char *label,long value,long hunk,int line,int flags)

{
  char *pcVar1;
  SymTab **ppSVar2;
  SymTab **hashindex;
  SymTab *chainsym;
  char local_a8 [2];
  char wnum [6];
  char wlab [128];
  int flags_local;
  int line_local;
  long hunk_local;
  long value_local;
  char *label_local;
  
  strcpy(local_a8,label);
  if ((('/' < *label) && (*label < ':')) || (*label == '\\')) {
    if (*label == '\\') {
      strcat(local_a8,"$");
    }
    sprintf((char *)((long)&chainsym + 2),"%d",(ulong)(uint)LabLine);
    strcat(local_a8,(char *)((long)&chainsym + 2));
  }
  Sym = SymLim;
  SymLim = SymLim + 1;
  if (0x2000 < (long)SymLim - (long)SymCurr) {
    Sym = (SymTab *)malloc(0x2000);
    if (Sym == (SymTab *)0x0) {
      quit_cleanup("Out of memory!\n");
    }
    SymCurr->Link = Sym;
    SymCurr = Sym;
    Sym->Link = (SymTab *)0x0;
    SymLim = Sym + 2;
    Sym = Sym + 1;
  }
  Sym->Link = (SymTab *)0x0;
  pcVar1 = AddName(local_a8,0);
  Sym->Nam = pcVar1;
  Sym->Val = value;
  Sym->Hunk = hunk;
  Sym->Defn = line;
  Sym->Flags = flags;
  Sym->Ref1 = (Ref *)0x0;
  NumSyms = NumSyms + 1;
  ppSVar2 = HashIt(local_a8);
  if (*ppSVar2 == (SymTab *)0x0) {
    *ppSVar2 = Sym;
  }
  else {
    for (hashindex = &(*ppSVar2)->Link; *hashindex != (SymTab *)0x0; hashindex = &(*hashindex)->Link
        ) {
    }
    *hashindex = Sym;
  }
  return;
}

Assistant:

void AddSymTab(label, value, hunk, line, flags)
	char label[];long value, hunk;int line, flags;
/* Inserts a new entry to the symbol table and increments NumSyms.
 "Sym" will be set to point to the new entry.
 If the label is a local label (i.e. the first character is
 a numeric digit or a backslash), the current contents of LabLine
 will be converted to characters and appended to the label before
 it is added.  If the first character of the label is a backslash
 (i.e. a named local variable) a dollar sign will be appended
 to the label ahead of the value of LabLine.                        */
{
	char wlab[MAXLINE], wnum[6];
	register struct SymTab *chainsym, **hashindex;

	strcpy(wlab, label);
	if (((label[0] >= '0') && (label[0] <= '9')) || (label[0] == '\\')) {
		if (label[0] == '\\')
			strcat(wlab, "$");
		sprintf(wnum, "%d", LabLine); /* If it's a local label, */
		strcat(wlab, wnum); /*    append LabLine.     */
	}

	Sym = SymLim; /* Pointer to new entry */
	SymLim++; /* Bump limit pointer. */
	if (((char *) SymLim - (char *) SymCurr) > CHUNKSIZE) {
		Sym = (struct SymTab *) malloc((unsigned) CHUNKSIZE);
		if (Sym == NULL)
			quit_cleanup("Out of memory!\n");
		SymCurr->Link = Sym; /* Link from previous chunk */
		SymCurr = Sym; /* Make the new chunk current. */
		SymCurr->Link = NULL; /* Clear forward pointer. */
		Sym++; /* Skip over pointer entry. */
		SymLim = Sym; /* New table limit */
		SymLim++; /* Bump it. */
	}
	Sym->Link = NULL; /* Clear hash chain link. */
	Sym->Nam = AddName(wlab, 0); /* Pointer to symbol */
	Sym->Val = value; /* Value */
	Sym->Hunk = hunk; /* Hunk number */
	Sym->Defn = line; /* Statement number */
	Sym->Flags = flags; /* Flags */
	Sym->Ref1 = NULL; /* Reference pointer */
	NumSyms++; /* Count symbols. */

	hashindex = HashIt(wlab); /* Get hash index. */
	if (*hashindex == NULL) {
		*hashindex = Sym; /* First entry in this hash chain */
		return;
	}
	chainsym = *hashindex;
	while (chainsym->Link != NULL)
		chainsym = chainsym->Link; /* Scan for end of hash chain. */
	chainsym->Link = Sym; /* Insert new entry at the end. */
}